

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O3

void aes192_ni_cbc_encrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  
  if (0 < blklen) {
    pauVar1 = (undefined1 (*) [16])((long)blklen + (long)vblk);
    auVar2 = *(undefined1 (*) [16])(ciph + -3);
    do {
      auVar2 = aesenc(*vblk ^ auVar2 ^ *(undefined1 (*) [16])(ciph + -0x3f),
                      *(undefined1 (*) [16])(ciph + -0x3d));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x3b));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x39));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x37));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x35));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x33));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x31));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x2f));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x2d));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x2b));
      auVar2 = aesenc(auVar2,*(undefined1 (*) [16])(ciph + -0x29));
      auVar2 = aesenclast(auVar2,*(undefined1 (*) [16])(ciph + -0x27));
      *(undefined1 (*) [16])vblk = auVar2;
      *(undefined1 (*) [16])(ciph + -3) = auVar2;
      vblk = (void *)((long)vblk + 0x10);
    } while (vblk < pauVar1);
  }
  return;
}

Assistant:

static inline void aes_cbc_ni_encrypt(
    ssh_cipher *ciph, void *vblk, int blklen, aes_ni_fn encrypt)
{
    aes_ni_context *ctx = container_of(ciph, aes_ni_context, ciph);

    for (uint8_t *blk = (uint8_t *)vblk, *finish = blk + blklen;
         blk < finish; blk += 16) {
        __m128i plaintext = _mm_loadu_si128((const __m128i *)blk);
        __m128i cipher_input = _mm_xor_si128(plaintext, ctx->iv);
        __m128i ciphertext = encrypt(cipher_input, ctx->keysched_e);
        _mm_storeu_si128((__m128i *)blk, ciphertext);
        ctx->iv = ciphertext;
    }
}